

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall CServerBrowser::Refresh(CServerBrowser *this,int RefreshFlags)

{
  uint uVar1;
  uint uVar2;
  int64 iVar3;
  CServerEntry *pCVar4;
  NETADDR *Addr;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  CNetChunk Packet;
  CPacker Packer;
  CNetChunk local_870;
  CPacker local_840;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_RefreshFlags = this->m_RefreshFlags | RefreshFlags;
  if ((RefreshFlags & 2U) != 0) {
    CHeap::Reset(&this->m_aServerlist[1].m_ServerlistHeap);
    this->m_aServerlist[1].m_NumServers = 0;
    this->m_aServerlist[1].m_NumClients = 0;
    this->m_aServerlist[1].m_NumPlayers = 0;
    mem_zero(this->m_aServerlist[1].m_aServerlistIp,0x800);
    if (this->m_ActServerlistType == 1) {
      CServerBrowserFilter::Clear(&this->m_ServerBrowserFilter);
    }
    uVar1 = rand();
    uVar2 = rand();
    this->m_CurrentLanToken = (uVar1 & 0x7fff) << 0x10 | uVar2 & 0xffff;
    CPacker::Reset(&local_840);
    CPacker::AddRaw(&local_840,SERVERBROWSE_GETINFO,8);
    CPacker::AddInt(&local_840,this->m_CurrentLanToken);
    mem_zero(&local_870,0x30);
    local_870.m_Address.type = (this->m_pNetClient->super_CNetBase).m_Socket.type | 4;
    local_870.m_ClientID = -1;
    local_870.m_Flags = 2;
    local_870.m_DataSize = (int)local_840.m_pCurrent - (int)&local_840;
    local_870.m_pData = &local_840;
    iVar3 = time_get();
    this->m_BroadcastTime = iVar3;
    iVar5 = -8;
    do {
      local_870.m_Address.port = (short)iVar5 + 0x2077;
      CNetClient::Send(this->m_pNetClient,&local_870,0xffffffff,(CSendCBData *)0x0);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    if (this->m_pConfig->m_Debug != 0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,2,"client_srvbrowse","broadcasting for servers");
    }
  }
  if ((RefreshFlags & 1U) != 0) {
    for (pCVar4 = this->m_pFirstReqServer; pCVar4 != (CServerEntry *)0x0;
        pCVar4 = pCVar4->m_pNextReq) {
      CNetClient::PurgeStoredPacket(this->m_pNetClient,pCVar4->m_TrackID);
    }
    CHeap::Reset(&this->m_aServerlist[0].m_ServerlistHeap);
    this->m_aServerlist[0].m_NumServers = 0;
    this->m_aServerlist[0].m_NumClients = 0;
    this->m_aServerlist[0].m_NumPlayers = 0;
    mem_zero(this->m_aServerlist[0].m_aServerlistIp,0x800);
    if (this->m_ActServerlistType == 0) {
      CServerBrowserFilter::Clear(&this->m_ServerBrowserFilter);
    }
    this->m_pFirstReqServer = (CServerEntry *)0x0;
    this->m_pLastReqServer = (CServerEntry *)0x0;
    this->m_NumRequests = 0;
    this->m_NeedRefresh = 1;
    iVar5 = (this->m_ServerBrowserFavorites).m_NumFavoriteServers;
    if (0 < iVar5) {
      Addr = &(this->m_ServerBrowserFavorites).m_aFavoriteServers[0].m_Addr;
      lVar6 = 0;
      do {
        if (2 < (int)Addr[1].type) {
          Set(this,Addr,2,-1,(CServerInfo *)0x0);
          iVar5 = (this->m_ServerBrowserFavorites).m_NumFavoriteServers;
        }
        lVar6 = lVar6 + 1;
        Addr = (NETADDR *)&Addr[7].port;
      } while (lVar6 < iVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::Refresh(int RefreshFlags)
{
	m_RefreshFlags |= RefreshFlags;

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_LAN)
	{
		// clear out everything
		m_aServerlist[IServerBrowser::TYPE_LAN].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_LAN)
			m_ServerBrowserFilter.Clear();

		// next token
		m_CurrentLanToken = GetNewToken();

		CPacker Packer;
		Packer.Reset();
		Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
		Packer.AddInt(m_CurrentLanToken);

		/* do the broadcast version */
		CNetChunk Packet;
		mem_zero(&Packet, sizeof(Packet));
		Packet.m_Address.type = m_pNetClient->NetType()|NETTYPE_LINK_BROADCAST;
		Packet.m_ClientID = -1;
		Packet.m_Flags = NETSENDFLAG_CONNLESS;
		Packet.m_DataSize = Packer.Size();
		Packet.m_pData = Packer.Data();
		m_BroadcastTime = time_get();

		for(int Port = LAN_PORT_BEGIN; Port <= LAN_PORT_END; Port++)
		{
			Packet.m_Address.port = Port;
			m_pNetClient->Send(&Packet);
		}

		if(Config()->m_Debug)
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", "broadcasting for servers");
	}

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
	{
		// clear out everything
		for(CServerEntry *pEntry = m_pFirstReqServer; pEntry; pEntry = pEntry->m_pNextReq)
		{
			m_pNetClient->PurgeStoredPacket(pEntry->m_TrackID);
		}
		m_aServerlist[IServerBrowser::TYPE_INTERNET].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_INTERNET)
			m_ServerBrowserFilter.Clear();
		m_pFirstReqServer = 0;
		m_pLastReqServer = 0;
		m_NumRequests = 0;

		m_NeedRefresh = 1;
		for(int i = 0; i < m_ServerBrowserFavorites.m_NumFavoriteServers; i++)
			if(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_State >= CServerBrowserFavorites::FAVSTATE_ADDR)
				Set(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_Addr, SET_FAV_ADD, -1, 0);
	}
}